

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<Data>::reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<Data> *this,exception_ptr *error)

{
  QPromise<Data> *pQVar1;
  Data *pDVar2;
  PromiseData<Data> *pPVar3;
  QPromise<Data> *promise;
  exception_ptr *error_local;
  PromiseResolver<Data> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<Data> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<Data>_>::operator->
                       (&(pQVar1->super_QPromiseBase<Data>).m_d);
    PromiseDataBase<Data,_void_(const_Data_&)>::reject<std::__exception_ptr::exception_ptr>
              (&pPVar3->super_PromiseDataBase<Data,_void_(const_Data_&)>,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<Data>_>::operator->
                       (&(pQVar1->super_QPromiseBase<Data>).m_d);
    PromiseDataBase<Data,_void_(const_Data_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<Data,_void_(const_Data_&)>);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }